

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::LoadConfig(cmCTestLaunch *this)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_1229;
  string local_1228;
  undefined1 local_1208 [8];
  string fname;
  undefined1 local_11d0 [8];
  cmMakefile mf;
  cmGlobalGenerator gg;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_389;
  string local_388;
  undefined1 local_368 [8];
  cmake cm;
  cmCTestLaunch *this_local;
  
  cm.TraceOnlyThisSources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &this->OptionOutput;
  cmake::cmake((cmake *)local_368,RoleScript,CTest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"",&local_389);
  cmake::SetHomeDirectory((cmake *)local_368,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"",&local_3c1);
  cmake::SetHomeOutputDirectory((cmake *)local_368,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_368);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_368);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)((long)&fname.field_2 + 8),(cmake *)local_368);
  cmMakefile::cmMakefile
            ((cmMakefile *)local_11d0,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,
             (cmStateSnapshot *)((long)&fname.field_2 + 8));
  std::__cxx11::string::string((string *)local_1208,(string *)&this->LogDir);
  std::__cxx11::string::operator+=((string *)local_1208,"CTestLaunchConfig.cmake");
  bVar1 = cmsys::SystemTools::FileExists((string *)local_1208);
  if ((bVar1) &&
     (bVar1 = cmMakefile::ReadListFile((cmMakefile *)local_11d0,(string *)local_1208), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1228,"CTEST_SOURCE_DIRECTORY",&local_1229);
    psVar2 = cmMakefile::GetSafeDefinition((cmMakefile *)local_11d0,&local_1228);
    std::__cxx11::string::operator=((string *)&this->SourceDir,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_1228);
    std::allocator<char>::~allocator(&local_1229);
    cmsys::SystemTools::ConvertToUnixSlashes(&this->SourceDir);
  }
  std::__cxx11::string::~string((string *)local_1208);
  cmMakefile::~cmMakefile((cmMakefile *)local_11d0);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
  cmake::~cmake((cmake *)local_368);
  return;
}

Assistant:

void cmCTestLaunch::LoadConfig()
{
  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  std::string fname = this->LogDir;
  fname += "CTestLaunchConfig.cmake";
  if (cmSystemTools::FileExists(fname) && mf.ReadListFile(fname)) {
    this->SourceDir = mf.GetSafeDefinition("CTEST_SOURCE_DIRECTORY");
    cmSystemTools::ConvertToUnixSlashes(this->SourceDir);
  }
}